

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

int __thiscall fmt::v8::file::pipe(file *this,int *__pipedes)

{
  int extraout_EAX;
  undefined8 uVar1;
  uint *puVar2;
  format_string<> fmt;
  file local_4c;
  file local_48 [4];
  char *local_38;
  undefined8 local_30;
  int local_24;
  int local_20;
  int result;
  int fds [2];
  file *write_end_local;
  file *read_end_local;
  
  fds = (int  [2])__pipedes;
  close(this,(int)__pipedes);
  close((file *)fds,(int)__pipedes);
  memset(&local_20,0,8);
  local_24 = ::pipe(&local_20);
  if (local_24 != 0) {
    uVar1 = __cxa_allocate_exception(0x20);
    puVar2 = (uint *)__errno_location();
    fmt.str_.data_ = (char *)(ulong)*puVar2;
    local_38 = "cannot create pipe";
    local_30 = 0x12;
    fmt.str_.size_ = (size_t)"cannot create pipe";
    system_error<>((int)uVar1,fmt);
    __cxa_throw(uVar1,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  file(local_48,local_20);
  operator=(this,local_48);
  ~file(local_48);
  file(&local_4c,result);
  operator=((file *)fds,&local_4c);
  ~file(&local_4c);
  return extraout_EAX;
}

Assistant:

void file::pipe(file& read_end, file& write_end) {
  // Close the descriptors first to make sure that assignments don't throw
  // and there are no leaks.
  read_end.close();
  write_end.close();
  int fds[2] = {};
#  ifdef _WIN32
  // Make the default pipe capacity same as on Linux 2.6.11+.
  enum { DEFAULT_CAPACITY = 65536 };
  int result = FMT_POSIX_CALL(pipe(fds, DEFAULT_CAPACITY, _O_BINARY));
#  else
  // Don't retry as the pipe function doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009696799/functions/pipe.html
  int result = FMT_POSIX_CALL(pipe(fds));
#  endif
  if (result != 0) FMT_THROW(system_error(errno, "cannot create pipe"));
  // The following assignments don't throw because read_fd and write_fd
  // are closed.
  read_end = file(fds[0]);
  write_end = file(fds[1]);
}